

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86_avx512::create_pipeline(LSTM_x86_avx512 *this,Option *opt)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  int *piVar13;
  Allocator *pAVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  void *pvVar20;
  void *pvVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  void *pvVar26;
  ulong uVar27;
  int _w;
  ulong uVar28;
  void *pvVar29;
  void *pvVar30;
  long lVar31;
  void *pvVar32;
  void *pvVar33;
  long lVar34;
  void *pvVar35;
  long lVar36;
  void *pvVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  long lVar41;
  void *pvVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  void *pvVar46;
  void *pvVar47;
  void *pvVar48;
  long lVar49;
  long lVar50;
  void *pvVar51;
  void *pvVar52;
  uint _c;
  long lVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  ulong local_220;
  undefined4 *local_218;
  ulong local_208;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  void *local_1a8;
  void *local_1a0;
  long local_198;
  long local_190;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  
  if ((this->super_LSTM).int8_scale_term == 0) {
    _c = ((this->super_LSTM).direction == 2) + 1;
    uVar28 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
    iVar1 = (this->super_LSTM).hidden_size;
    uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) / (long)iVar1;
    uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) / 4;
    _w = (int)uVar28;
    Mat::create(&this->weight_xc_data_packed,_w,iVar1 % 2 + iVar1 / 2,_c,0x20,8,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,(this->super_LSTM).hidden_size,1,_c,0x10,4,
                (Allocator *)0x0);
    iVar1 = (this->super_LSTM).hidden_size;
    Mat::create(&this->weight_hc_data_packed,(this->super_LSTM).num_output,iVar1 % 2 + iVar1 / 2,_c,
                0x20,8,(Allocator *)0x0);
    sVar3 = (this->super_LSTM).weight_xc_data.elemsize;
    lVar18 = (this->super_LSTM).weight_xc_data.cstep * sVar3;
    sVar4 = (this->super_LSTM).bias_c_data.elemsize;
    sVar5 = (this->super_LSTM).bias_c_data.cstep;
    sVar6 = (this->super_LSTM).weight_hc_data.elemsize;
    lVar19 = (this->super_LSTM).weight_hc_data.cstep * sVar6;
    sVar7 = (this->weight_xc_data_packed).elemsize;
    sVar8 = (this->bias_c_data_packed).cstep;
    sVar9 = (this->bias_c_data_packed).elemsize;
    sVar10 = (this->weight_hc_data_packed).elemsize;
    lVar36 = (long)(this->super_LSTM).bias_c_data.w * sVar4;
    iVar1 = (this->super_LSTM).hidden_size;
    lVar34 = (long)iVar1;
    uVar28 = uVar28 & 0xffffffff;
    if (_w < 1) {
      uVar28 = 0;
    }
    lVar53 = (long)(this->super_LSTM).weight_xc_data.w * sVar3;
    lVar31 = (this->weight_xc_data_packed).cstep * sVar7;
    lVar38 = (long)(this->weight_xc_data_packed).w * sVar7;
    lVar49 = (long)(this->super_LSTM).weight_hc_data.w * sVar6;
    lVar22 = (this->weight_hc_data_packed).cstep * sVar10;
    lVar41 = (long)(this->weight_hc_data_packed).w * sVar10;
    lVar45 = (long)(iVar1 * 2);
    lVar50 = (long)(iVar1 * 3);
    pvVar30 = (this->super_LSTM).weight_xc_data.data;
    pvVar23 = (void *)(lVar53 * (lVar50 + 1) + (long)pvVar30);
    local_1a0 = (void *)(lVar53 * (lVar45 + 1) + (long)pvVar30);
    local_1b0 = (void *)(lVar53 * (lVar34 + 1) + (long)pvVar30);
    local_1b8 = (void *)(lVar53 * lVar50 + (long)pvVar30);
    local_1c0 = (void *)(lVar53 * lVar45 + (long)pvVar30);
    local_1c8 = (void *)(lVar53 * lVar34 + (long)pvVar30);
    pvVar40 = (this->super_LSTM).weight_hc_data.data;
    pvVar42 = (void *)((lVar50 + 1) * lVar49 + (long)pvVar40);
    pvVar20 = (void *)((lVar45 + 1) * lVar49 + (long)pvVar40);
    local_1a8 = (void *)((lVar34 + 1) * lVar49 + (long)pvVar40);
    pvVar51 = (void *)(lVar50 * lVar49 + (long)pvVar40);
    pvVar46 = (void *)(lVar45 * lVar49 + (long)pvVar40);
    local_1d0 = (void *)(lVar49 * lVar34 + (long)pvVar40);
    pvVar11 = (this->super_LSTM).bias_c_data.data;
    local_1d8 = (this->weight_xc_data_packed).data;
    pvVar12 = (this->bias_c_data_packed).data;
    pvVar33 = (this->weight_hc_data_packed).data;
    lVar45 = lVar53 * 2;
    local_1e0 = (void *)((long)pvVar30 + lVar53);
    lVar50 = lVar49 * 2;
    local_1e8 = (void *)((long)pvVar40 + lVar49);
    local_190 = (long)local_1d8 + 8;
    local_198 = (long)pvVar33 + 8;
    for (uVar27 = 0; uVar27 != _c; uVar27 = uVar27 + 1) {
      lVar24 = sVar5 * sVar4 * uVar27;
      local_218 = (undefined4 *)(sVar8 * sVar9 * uVar27 + (long)pvVar12);
      lVar15 = lVar36 + lVar24;
      lVar16 = lVar36 * 2 + lVar24;
      lVar17 = lVar36 * 3 + lVar24;
      uVar2 = (this->super_LSTM).num_output;
      local_208 = 0;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      local_138 = local_1e8;
      local_140 = local_1a8;
      local_158 = local_1e0;
      local_160 = local_1b0;
      local_168 = local_1a0;
      pvVar21 = pvVar30;
      pvVar25 = local_1b8;
      pvVar26 = pvVar40;
      pvVar29 = local_1c0;
      pvVar32 = pvVar33;
      pvVar35 = local_1c8;
      pvVar37 = pvVar23;
      pvVar39 = local_1d0;
      pvVar47 = pvVar46;
      pvVar48 = local_1d8;
      pvVar52 = pvVar51;
      local_150 = pvVar42;
      local_148 = pvVar20;
      for (local_220 = 0; uVar54 = local_220 | 1, (long)uVar54 < lVar34; local_220 = local_220 + 2)
      {
        *local_218 = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar24);
        local_218[1] = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar15);
        local_218[2] = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar16);
        local_218[3] = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar17);
        local_218[4] = *(undefined4 *)((long)pvVar11 + uVar54 * 4 + lVar24);
        local_218[5] = *(undefined4 *)((long)pvVar11 + uVar54 * 4 + lVar15);
        local_218[6] = *(undefined4 *)((long)pvVar11 + uVar54 * 4 + lVar16);
        local_218[7] = *(undefined4 *)((long)pvVar11 + uVar54 * 4 + lVar17);
        for (lVar55 = 0; uVar28 << 2 != lVar55; lVar55 = lVar55 + 4) {
          *(undefined4 *)((long)pvVar48 + lVar55 * 8) = *(undefined4 *)((long)pvVar21 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 4) = *(undefined4 *)((long)pvVar35 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 8) = *(undefined4 *)((long)pvVar29 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 0xc) =
               *(undefined4 *)((long)pvVar25 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 0x10) =
               *(undefined4 *)((long)local_158 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 0x14) =
               *(undefined4 *)((long)local_160 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 0x18) =
               *(undefined4 *)((long)local_168 + lVar55);
          *(undefined4 *)((long)pvVar48 + lVar55 * 8 + 0x1c) =
               *(undefined4 *)((long)pvVar37 + lVar55);
        }
        for (lVar55 = 0; (ulong)uVar2 << 2 != lVar55; lVar55 = lVar55 + 4) {
          *(undefined4 *)((long)pvVar32 + lVar55 * 8) = *(undefined4 *)((long)pvVar26 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 4) = *(undefined4 *)((long)pvVar39 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 8) = *(undefined4 *)((long)pvVar47 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 0xc) =
               *(undefined4 *)((long)pvVar52 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 0x10) =
               *(undefined4 *)((long)local_138 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 0x14) =
               *(undefined4 *)((long)local_140 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 0x18) =
               *(undefined4 *)((long)local_148 + lVar55);
          *(undefined4 *)((long)pvVar32 + lVar55 * 8 + 0x1c) =
               *(undefined4 *)((long)local_150 + lVar55);
        }
        local_218 = local_218 + 8;
        pvVar37 = (void *)((long)pvVar37 + lVar45);
        local_168 = (void *)((long)local_168 + lVar45);
        local_160 = (void *)((long)local_160 + lVar45);
        local_158 = (void *)((long)local_158 + lVar45);
        pvVar25 = (void *)((long)pvVar25 + lVar45);
        pvVar29 = (void *)((long)pvVar29 + lVar45);
        pvVar35 = (void *)((long)pvVar35 + lVar45);
        pvVar21 = (void *)((long)pvVar21 + lVar45);
        pvVar48 = (void *)((long)pvVar48 + lVar38);
        local_150 = (void *)((long)local_150 + lVar50);
        local_148 = (void *)((long)local_148 + lVar50);
        local_140 = (void *)((long)local_140 + lVar50);
        local_138 = (void *)((long)local_138 + lVar50);
        pvVar52 = (void *)((long)pvVar52 + lVar50);
        pvVar47 = (void *)((long)pvVar47 + lVar50);
        pvVar39 = (void *)((long)pvVar39 + lVar50);
        pvVar26 = (void *)((long)pvVar26 + lVar50);
        pvVar32 = (void *)((long)pvVar32 + lVar41);
        local_208 = (ulong)((int)local_208 + 2);
      }
      uVar2 = (this->super_LSTM).num_output;
      uVar54 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar54 = 0;
      }
      for (; (long)local_220 < lVar34; local_220 = local_220 + 1) {
        uVar43 = (ulong)(((uint)local_208 & 1) + (int)(local_208 >> 1));
        lVar55 = lVar41 * uVar43 + local_198;
        lVar44 = uVar43 * lVar38 + local_190;
        *local_218 = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar24);
        local_218[1] = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar15);
        local_218[2] = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar16);
        local_218[3] = *(undefined4 *)((long)pvVar11 + local_220 * 4 + lVar17);
        for (lVar56 = 0; uVar28 << 2 != lVar56; lVar56 = lVar56 + 4) {
          *(undefined4 *)(lVar44 + -8 + lVar56 * 4) = *(undefined4 *)((long)pvVar21 + lVar56);
          *(undefined4 *)(lVar44 + -4 + lVar56 * 4) = *(undefined4 *)((long)pvVar35 + lVar56);
          *(undefined4 *)(lVar44 + lVar56 * 4) = *(undefined4 *)((long)pvVar29 + lVar56);
          *(undefined4 *)(lVar44 + 4 + lVar56 * 4) = *(undefined4 *)((long)pvVar25 + lVar56);
        }
        for (lVar44 = 0; uVar54 * 4 != lVar44; lVar44 = lVar44 + 4) {
          *(undefined4 *)(lVar55 + -8 + lVar44 * 4) = *(undefined4 *)((long)pvVar26 + lVar44);
          *(undefined4 *)(lVar55 + -4 + lVar44 * 4) = *(undefined4 *)((long)pvVar39 + lVar44);
          *(undefined4 *)(lVar55 + lVar44 * 4) = *(undefined4 *)((long)pvVar47 + lVar44);
          *(undefined4 *)(lVar55 + 4 + lVar44 * 4) = *(undefined4 *)((long)pvVar52 + lVar44);
        }
        local_218 = local_218 + 4;
        pvVar25 = (void *)((long)pvVar25 + lVar53);
        pvVar29 = (void *)((long)pvVar29 + lVar53);
        pvVar35 = (void *)((long)pvVar35 + lVar53);
        pvVar21 = (void *)((long)pvVar21 + lVar53);
        local_208 = (ulong)((uint)local_208 + 1);
        pvVar52 = (void *)((long)pvVar52 + lVar49);
        pvVar47 = (void *)((long)pvVar47 + lVar49);
        pvVar39 = (void *)((long)pvVar39 + lVar49);
        pvVar26 = (void *)((long)pvVar26 + lVar49);
      }
      pvVar23 = (void *)((long)pvVar23 + lVar18);
      local_1a0 = (void *)((long)local_1a0 + lVar18);
      local_1b0 = (void *)((long)local_1b0 + lVar18);
      local_1e0 = (void *)((long)local_1e0 + lVar18);
      local_1b8 = (void *)((long)local_1b8 + lVar18);
      local_1c0 = (void *)((long)local_1c0 + lVar18);
      local_1c8 = (void *)((long)local_1c8 + lVar18);
      pvVar30 = (void *)((long)pvVar30 + lVar18);
      local_1d8 = (void *)((long)local_1d8 + lVar31);
      pvVar42 = (void *)((long)pvVar42 + lVar19);
      pvVar20 = (void *)((long)pvVar20 + lVar19);
      local_1a8 = (void *)((long)local_1a8 + lVar19);
      local_1e8 = (void *)((long)local_1e8 + lVar19);
      pvVar51 = (void *)((long)pvVar51 + lVar19);
      pvVar46 = (void *)((long)pvVar46 + lVar19);
      local_1d0 = (void *)((long)local_1d0 + lVar19);
      pvVar40 = (void *)((long)pvVar40 + lVar19);
      pvVar33 = (void *)((long)pvVar33 + lVar22);
      local_190 = local_190 + lVar31;
      local_198 = local_198 + lVar22;
    }
    if (opt->lightmode != false) {
      piVar13 = (this->super_LSTM).weight_xc_data.refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pAVar14 = (this->super_LSTM).weight_xc_data.allocator;
          if (pAVar14 == (Allocator *)0x0) {
            free((this->super_LSTM).weight_xc_data.data);
          }
          else {
            (*pAVar14->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_xc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_xc_data.data = (void *)0x0;
      (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_xc_data.c = 0;
      (this->super_LSTM).weight_xc_data.dims = 0;
      (this->super_LSTM).weight_xc_data.w = 0;
      (this->super_LSTM).weight_xc_data.h = 0;
      (this->super_LSTM).weight_xc_data.d = 0;
      piVar13 = (this->super_LSTM).bias_c_data.refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pAVar14 = (this->super_LSTM).bias_c_data.allocator;
          if (pAVar14 == (Allocator *)0x0) {
            free((this->super_LSTM).bias_c_data.data);
          }
          else {
            (*pAVar14->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).bias_c_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
      (this->super_LSTM).bias_c_data.data = (void *)0x0;
      (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
      (this->super_LSTM).bias_c_data.c = 0;
      (this->super_LSTM).bias_c_data.dims = 0;
      (this->super_LSTM).bias_c_data.w = 0;
      (this->super_LSTM).bias_c_data.h = 0;
      (this->super_LSTM).bias_c_data.d = 0;
      piVar13 = (this->super_LSTM).weight_hc_data.refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pAVar14 = (this->super_LSTM).weight_hc_data.allocator;
          if (pAVar14 == (Allocator *)0x0) {
            free((this->super_LSTM).weight_hc_data.data);
          }
          else {
            (*pAVar14->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_hc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_hc_data.data = (void *)0x0;
      (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_hc_data.dims = 0;
      (this->super_LSTM).weight_hc_data.w = 0;
      (this->super_LSTM).weight_hc_data.h = 0;
      (this->super_LSTM).weight_hc_data.d = 0;
      (this->super_LSTM).weight_hc_data.c = 0;
    }
  }
  else {
    create_pipeline_int8(this,opt);
  }
  return 0;
}

Assistant:

int LSTM_x86_avx512::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}